

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver-c.cc
# Opt level: O1

int NLW2_SolveFeederHandler_C
              (NLW2_NLSolver_C *pnls,NLW2_NLFeeder_C *nlf_c,NLW2_SOLHandler_C *solh_c,char *solver,
              char *solver_opts)

{
  NLSolver *this;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  NLW2_SOLHandler_C_Impl *pNVar5;
  byte bVar6;
  NLW2_SOLHandler_C_Impl solh;
  NLW2_NLFeeder_C_Impl nlf;
  allocator<char> local_1a2;
  allocator<char> local_1a1;
  string local_1a0;
  string local_180;
  NLW2_SOLHandler_C_Impl local_160;
  NLW2_NLFeeder_C_Impl local_110;
  
  bVar6 = 0;
  memcpy(&local_110,nlf_c,0xe0);
  pNVar5 = &local_160;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pNVar5->solh2_c_).p_user_data_ = solh_c->p_user_data_;
    solh_c = (NLW2_SOLHandler_C *)((long)solh_c + (ulong)bVar6 * -0x10 + 8);
    pNVar5 = (NLW2_SOLHandler_C_Impl *)((long)pNVar5 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  bVar1 = mp::NLSolver::LoadModel<mp::NLW2_NLFeeder_C_Impl>((NLSolver *)pnls->p_nlsol_,&local_110);
  if (bVar1) {
    this = (NLSolver *)pnls->p_nlsol_;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,solver,&local_1a1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,solver_opts,&local_1a2);
    bVar2 = mp::NLSolver::Solve(this,&local_180,&local_1a0);
    if (bVar2) {
      bVar2 = mp::NLSolver::ReadSolution<mp::NLW2_SOLHandler_C_Impl>
                        ((NLSolver *)pnls->p_nlsol_,&local_160);
      uVar3 = (uint)bVar2;
      goto LAB_001069d3;
    }
  }
  uVar3 = 0;
LAB_001069d3:
  if (bVar1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
  }
  return uVar3;
}

Assistant:

int NLW2_SolveFeederHandler_C(NLW2_NLSolver_C* pnls,
                              NLW2_NLFeeder_C* nlf_c,
                              NLW2_SOLHandler_C* solh_c,
                              const char* solver,
                              const char* solver_opts) {
  mp::NLW2_NLFeeder_C_Impl nlf(nlf_c);
  mp::NLW2_SOLHandler_C_Impl solh(solh_c);
  return ((mp::NLSOL_C_Impl*)(pnls->p_nlsol_))
      ->LoadModel(nlf)
      && ((mp::NLSOL_C_Impl*)(pnls->p_nlsol_))
      ->Solve(solver, solver_opts)
      && ((mp::NLSOL_C_Impl*)(pnls->p_nlsol_))
      ->ReadSolution(solh);
}